

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SocketServer.cpp
# Opt level: O0

bool __thiscall SocketServer::commonListen(SocketServer *this)

{
  FILE *__stream;
  bool bVar1;
  int iVar2;
  int *piVar3;
  char *pcVar4;
  element_type *this_00;
  SocketServer **ppSVar5;
  Error local_c4;
  SocketServer *local_c0;
  SocketServer *local_b8;
  code *local_b0;
  undefined8 local_a8;
  type local_a0;
  function<void_(int,_unsigned_int)> local_88;
  undefined1 local_68 [8];
  SharedPtr loop;
  SocketServer *local_50 [3];
  String local_38;
  SocketServer *local_18;
  SocketServer *this_local;
  
  local_18 = this;
  iVar2 = ::listen(this->fd,0x80);
  __stream = _stderr;
  if (iVar2 < 0) {
    piVar3 = __errno_location();
    Rct::strerror((Rct *)&local_38,*piVar3);
    pcVar4 = String::constData(&local_38);
    fprintf(__stream,"::listen() failed with errno: %s\n",pcVar4);
    String::~String(&local_38);
    loop.super___shared_ptr<EventLoop,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._4_4_ = 2;
    ppSVar5 = local_50;
    local_50[0] = this;
    Signal<std::function<void(SocketServer*,SocketServer::Error)>>::operator()
              (&this->serverError,ppSVar5,
               (Error *)((long)&loop.super___shared_ptr<EventLoop,_(__gnu_cxx::_Lock_policy)2>.
                                _M_refcount._M_pi + 4));
    close(this,(int)ppSVar5);
    this_local._7_1_ = 0;
    goto LAB_0028caaa;
  }
  EventLoop::eventLoop();
  bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)local_68);
  if (bVar1) {
    this_00 = std::__shared_ptr_access<EventLoop,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
              operator->((__shared_ptr_access<EventLoop,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
                         )local_68);
    iVar2 = this->fd;
    local_b0 = socketCallback;
    local_a8 = 0;
    local_b8 = this;
    std::
    bind<void(SocketServer::*)(int,int),SocketServer*,std::_Placeholder<1>const&,std::_Placeholder<2>const&>
              (&local_a0,(offset_in_SocketServer_to_subr *)&local_b0,&local_b8,
               (_Placeholder<1> *)&std::placeholders::_1,(_Placeholder<2> *)&std::placeholders::_2);
    std::function<void(int,unsigned_int)>::
    function<std::_Bind<void(SocketServer::*(SocketServer*,std::_Placeholder<1>,std::_Placeholder<2>))(int,int)>,void>
              ((function<void(int,unsigned_int)> *)&local_88,&local_a0);
    EventLoop::registerSocket(this_00,iVar2,1,&local_88);
    std::function<void_(int,_unsigned_int)>::~function(&local_88);
    bVar1 = SocketClient::setFlags(this->fd,0x800,3,4,FlagAppend);
    if (bVar1) goto LAB_0028ca78;
    local_c4 = InitializeError;
    ppSVar5 = &local_c0;
    local_c0 = this;
    Signal<std::function<void(SocketServer*,SocketServer::Error)>>::operator()
              (&this->serverError,ppSVar5,&local_c4);
    close(this,(int)ppSVar5);
    this_local._7_1_ = 0;
    bVar1 = true;
  }
  else {
LAB_0028ca78:
    bVar1 = false;
  }
  std::shared_ptr<EventLoop>::~shared_ptr((shared_ptr<EventLoop> *)local_68);
  if (!bVar1) {
    this_local._7_1_ = 1;
  }
LAB_0028caaa:
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool SocketServer::commonListen()
{
    // ### should be able to customize the backlog
    enum { Backlog = 128 };
    if (::listen(fd, Backlog) < 0) {
        fprintf(stderr, "::listen() failed with errno: %s\n",
                Rct::strerror().constData());

        serverError(this, ListenError);
        close();
        return false;
    }

    if (EventLoop::SharedPtr loop = EventLoop::eventLoop()) {
        loop->registerSocket(fd, EventLoop::SocketRead,
                             //|EventLoop::SocketWrite,
                             std::bind(&SocketServer::socketCallback,
                                       this,
                                       std::placeholders::_1,
                                       std::placeholders::_2));
#ifndef _WIN32
        if (!SocketClient::setFlags(fd, O_NONBLOCK, F_GETFL, F_SETFL)) {
            serverError(this, InitializeError);
            close();
            return false;
        }
#endif
    }

    return true;
}